

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecWrd.h
# Opt level: O1

void Vec_WrdPushOrder(Vec_Wrd_t *p,word Entry)

{
  uint uVar1;
  ulong uVar2;
  bool bVar3;
  word *pwVar4;
  long lVar5;
  int iVar6;
  
  uVar1 = p->nCap;
  if (p->nSize == uVar1) {
    if ((int)uVar1 < 0x10) {
      if (p->pArray == (word *)0x0) {
        pwVar4 = (word *)malloc(0x80);
      }
      else {
        pwVar4 = (word *)realloc(p->pArray,0x80);
      }
      p->pArray = pwVar4;
      iVar6 = 0x10;
    }
    else {
      iVar6 = uVar1 * 2;
      if (iVar6 <= (int)uVar1) goto LAB_0025fc77;
      if (p->pArray == (word *)0x0) {
        pwVar4 = (word *)malloc((ulong)uVar1 << 4);
      }
      else {
        pwVar4 = (word *)realloc(p->pArray,(ulong)uVar1 << 4);
      }
      p->pArray = pwVar4;
    }
    if (pwVar4 == (word *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                    ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
    }
    p->nCap = iVar6;
  }
LAB_0025fc77:
  lVar5 = (long)p->nSize;
  p->nSize = p->nSize + 1;
  if (0 < lVar5) {
    pwVar4 = p->pArray;
    do {
      uVar2 = pwVar4[lVar5 + -1];
      if (uVar2 <= Entry) goto LAB_0025fca8;
      pwVar4[lVar5] = uVar2;
      bVar3 = 1 < lVar5;
      lVar5 = lVar5 + -1;
    } while (bVar3);
    lVar5 = 0;
  }
LAB_0025fca8:
  p->pArray[(int)lVar5] = Entry;
  return;
}

Assistant:

static inline void Vec_WrdPushOrder( Vec_Wrd_t * p, word Entry )
{
    int i;
    if ( p->nSize == p->nCap )
    {
        if ( p->nCap < 16 )
            Vec_WrdGrow( p, 16 );
        else
            Vec_WrdGrow( p, 2 * p->nCap );
    }
    p->nSize++;
    for ( i = p->nSize-2; i >= 0; i-- )
        if ( p->pArray[i] > Entry )
            p->pArray[i+1] = p->pArray[i];
        else
            break;
    p->pArray[i+1] = Entry;
}